

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O3

void __thiscall
lr_grammar::GrammarLR::closure
          (GrammarLR *this,vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_> *result
          )

{
  int iVar1;
  long lVar2;
  pointer pEVar3;
  pointer pPVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_> tmp;
  vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_> local_68;
  Project local_44;
  vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_> *local_38;
  
  local_68.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>._M_impl.
  super__Vector_impl_data._M_start = (Project *)0x0;
  local_68.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>._M_impl.
  super__Vector_impl_data._M_finish = (Project *)0x0;
  local_68.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Project *)0x0;
  pPVar4 = (result->super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((result->super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>).
      _M_impl.super__Vector_impl_data._M_finish != pPVar4) {
    uVar9 = 0;
    local_38 = result;
    do {
      lVar8 = (long)pPVar4[uVar9].expressIndex;
      lVar2 = *(long *)&(this->elements).
                        super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                        ._M_impl.super__Vector_impl_data._M_start[pPVar4[uVar9].elemKey].
                        expression_of_set.
                        super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                        ._M_impl.super__Vector_impl_data;
      if (*(long *)(lVar2 + 8 + lVar8 * 0x18) - *(long *)(lVar2 + lVar8 * 0x18) >> 2 !=
          (long)pPVar4[uVar9].projectPoint) {
        piVar5 = base_grammar::Express::operator[]
                           ((Express *)(lVar2 + lVar8 * 0x18),pPVar4[uVar9].projectPoint);
        iVar1 = *piVar5;
        pEVar3 = (this->elements).
                 super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (pEVar3[iVar1].super_Elem.is_finally == false) {
          if (local_68.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_68.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_68.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_68.
                 super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          }
          if (*(pointer *)
               ((long)&pEVar3[iVar1].expression_of_set.
                       super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                       ._M_impl + 8) !=
              pEVar3[iVar1].expression_of_set.
              super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            uVar7 = 0;
            do {
              local_44.expressIndex = (int)uVar7;
              local_44.projectPoint = 0;
              local_44.elemKey = iVar1;
              if (local_68.
                  super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_68.
                  super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>::
                _M_realloc_insert<lr_grammar::Project>
                          (&local_68,
                           (iterator)
                           local_68.
                           super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_44);
              }
              else {
                (local_68.
                 super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->projectPoint = 0;
                (local_68.
                 super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->elemKey = iVar1;
                (local_68.
                 super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->expressIndex = local_44.expressIndex;
                local_68.
                super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_68.
                     super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              pEVar3 = (this->elements).
                       super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar7 = uVar7 + 1;
              uVar6 = ((long)*(pointer *)
                              ((long)&pEVar3[iVar1].expression_of_set.
                                      super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                      ._M_impl + 8) -
                       *(long *)&pEVar3[iVar1].expression_of_set.
                                 super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                 ._M_impl.super__Vector_impl_data >> 3) * -0x5555555555555555;
            } while (uVar7 <= uVar6 && uVar6 - uVar7 != 0);
          }
          result = local_38;
          conncet_vector(local_38,&local_68);
        }
      }
      uVar9 = uVar9 + 1;
      pPVar4 = (result->
               super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar7 = ((long)(result->
                     super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 2) *
              -0x5555555555555555;
    } while (uVar9 <= uVar7 && uVar7 - uVar9 != 0);
    if (local_68.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
        _M_impl.super__Vector_impl_data._M_start != (Project *)0x0) {
      operator_delete(local_68.
                      super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

DFAState::DFAState(const DFAState& a){
    for (int i = 0; i < a.projects.size(); i++){
        this->projects.push_back(a.projects[i]);
    }
    this->statesCount = a.statesCount;

    this->next = new int[a.elementCount];
    this->elementCount = a.elementCount;
    for (int i = 0; i < elementCount; i++){
        next[i] = a.next[i];
    }
}